

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

ptr<req_msg> __thiscall
nuraft::raft_server::create_sync_snapshot_req
          (raft_server *this,ptr<peer> *pp,ulong last_log_idx,ulong term,ulong commit_idx,
          bool *succeeded_out)

{
  bool bVar1;
  type tVar2;
  uint uVar3;
  int iVar4;
  __int_type_conflict1 _Var5;
  int32 iVar6;
  void **ppvVar7;
  element_type *peVar8;
  element_type *peVar9;
  ulong uVar10;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  element_type *peVar14;
  raft_server *prVar15;
  element_type *peVar16;
  element_type *peVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  msg_type *args_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *args_2;
  element_type *this_00;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *args;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  ptr<req_msg> pVar21;
  undefined1 *in_stack_00000008;
  unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_> sync_req;
  int rc;
  void **user_snp_ctx;
  ulong obj_idx;
  int32 sz_rd;
  int32 blk_sz;
  ulong sz_left;
  ulong offset;
  ulong data_idx;
  ptr<buffer> data;
  bool last_request;
  ulong snp_timeout_ms;
  ulong prev_sync_snp_log_idx;
  ptr<snapshot> snp;
  ptr<snapshot_sync_ctx> sync_ctx;
  unique_lock<std::mutex> guard;
  ptr<raft_params> params;
  peer *p;
  ptr<req_msg> *req;
  pointer in_stack_fffffffffffffa48;
  value_type *__x;
  unique_lock<std::mutex> *in_stack_fffffffffffffa50;
  ptr<buffer> *in_stack_fffffffffffffa58;
  raft_server *in_stack_fffffffffffffa60;
  raft_server *in_stack_fffffffffffffa68;
  snapshot_sync_req *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  unsigned_long *in_stack_fffffffffffffa90;
  timer_helper *in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  ptr<snapshot_sync_ctx> *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  snapshot_sync_req *in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  ptr<raft_server> *in_stack_fffffffffffffac8;
  snapshot_io_mgr *in_stack_fffffffffffffad0;
  peer *pp_00;
  unsigned_long local_488;
  undefined7 in_stack_fffffffffffffb98;
  value_type local_2d0;
  int32 local_2bc;
  undefined4 local_2b8;
  undefined1 local_2b1;
  string local_2a8 [36];
  uint local_284;
  string local_280 [32];
  void **local_260;
  raft_server *local_258;
  string local_240 [36];
  uint local_21c;
  unsigned_long local_218 [3];
  int32 local_1fc;
  unsigned_long local_1f8 [3];
  raft_server *local_1e0;
  raft_server *local_1d8;
  __shared_ptr local_1d0 [19];
  undefined1 local_1bd;
  undefined4 local_1bc;
  long local_188;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [64];
  string local_d0 [32];
  string local_b0 [32];
  ulong local_90;
  __shared_ptr local_88 [16];
  undefined1 local_78 [88];
  ulong local_20;
  
  *in_stack_00000008 = 0;
  local_20 = in_RCX;
  local_78._64_8_ =
       std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                 ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  in_stack_fffffffffffffa50);
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2ffc86);
  nuraft::context::get_params((context *)in_stack_fffffffffffffa68);
  peer::get_lock((peer *)local_78._64_8_);
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_fffffffffffffa50,(mutex_type *)in_stack_fffffffffffffa48);
  peer::get_snapshot_sync_ctx((peer *)in_stack_fffffffffffffa68);
  std::shared_ptr<nuraft::snapshot>::shared_ptr
            ((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  local_90 = 0;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
  if (bVar1) {
    peVar14 = std::
              __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2ffd1b);
    snapshot_sync_ctx::get_snapshot(peVar14);
    std::shared_ptr<nuraft::snapshot>::operator=
              ((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffa50,
               &in_stack_fffffffffffffa48->snapshot_);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2ffd73);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (4 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2ffdac);
        peVar8 = std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *)
                            local_78);
        peVar14 = std::
                  __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2ffdde);
        uVar10 = snapshot_sync_ctx::get_offset(peVar14);
        peVar9 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ffdfd);
        uVar20 = snapshot::get_last_log_idx(peVar9);
        peVar14 = std::
                  __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2ffe1c);
        ppvVar7 = snapshot_sync_ctx::get_user_snp_ctx(peVar14);
        msg_if_given_abi_cxx11_
                  ((char *)local_b0,
                   "previous sync_ctx exists %p, offset %lu, snp idx %lu, user_ctx %p",peVar8,uVar10
                   ,uVar20,*ppvVar7);
        (*peVar11->_vptr_logger[8])
                  (peVar11,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x5c,local_b0);
        std::__cxx11::string::~string(local_b0);
      }
    }
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2fff2a);
    local_90 = snapshot::get_last_log_idx(peVar9);
    peVar14 = std::
              __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2fff59);
    snapshot_sync_ctx::get_timer(peVar14);
    bVar1 = timer_helper::timeout(in_stack_fffffffffffffa98);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar1) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2fffc2);
        iVar4 = (*peVar11->_vptr_logger[7])();
        if (3 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2ffffb);
          peVar8 = std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::get
                             ((__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *
                              )local_78);
          msg_if_given_abi_cxx11_
                    ((char *)local_d0,"previous sync_ctx %p timed out, reset it",peVar8);
          (*peVar11->_vptr_logger[8])
                    (peVar11,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x60,local_d0);
          std::__cxx11::string::~string(local_d0);
        }
      }
      std::shared_ptr<nuraft::snapshot_sync_ctx>::shared_ptr
                ((shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffa50,
                 (shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffa48);
      destroy_user_snp_ctx
                ((raft_server *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 in_stack_fffffffffffffaa8);
      std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
                ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x3000d5);
      std::__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_fffffffffffffa60);
      std::__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_fffffffffffffa60);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_88);
  if (bVar1) {
    peVar14 = std::
              __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x300139);
    uVar10 = snapshot_sync_ctx::get_offset(peVar14);
    if (uVar10 == 0) goto LAB_0030015d;
  }
  else {
LAB_0030015d:
    get_last_snapshot(in_stack_fffffffffffffa68);
    std::shared_ptr<nuraft::snapshot>::operator=
              ((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffa50,
               &in_stack_fffffffffffffa48->snapshot_);
    std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x300196);
    bVar1 = std::operator==((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffa50,
                            in_stack_fffffffffffffa48);
    uVar18 = local_20;
    if (bVar1) {
LAB_003001f3:
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar1) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x300224);
        iVar4 = (*peVar11->_vptr_logger[7])();
        if (1 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x30025d);
          uVar3 = peer::get_id((peer *)0x300272);
          bVar1 = std::operator==((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffa50,
                                  in_stack_fffffffffffffa48);
          uVar18 = local_20;
          peVar9 = std::
                   __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3002bb);
          uVar10 = snapshot::get_last_log_idx(peVar9);
          msg_if_given_abi_cxx11_
                    ((char *)local_110,
                     "system is running into fatal errors, failed to find a snapshot for peer %d (snapshot null: %d, snapshot doesn\'t contais lastLogIndex: %d)"
                     ,(ulong)uVar3,(ulong)bVar1,(ulong)(uVar10 < uVar18));
          (*peVar11->_vptr_logger[8])
                    (peVar11,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x78,local_110);
          std::__cxx11::string::~string(local_110);
        }
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_88);
      if ((bVar1) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318)), bVar1)
         ) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x3003bd);
        iVar4 = (*peVar11->_vptr_logger[7])();
        if (1 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x3003f6);
          peVar9 = std::
                   __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x30041b);
          uVar10 = snapshot::get_last_log_idx(peVar9);
          msg_if_given_abi_cxx11_
                    ((char *)local_130,"last log idx %lu, snp last log idx %lu",local_20,uVar10);
          (*peVar11->_vptr_logger[8])
                    (peVar11,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0x7b,local_130);
          std::__cxx11::string::~string(local_130);
        }
      }
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x3004d4);
      peVar12 = std::
                __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3004dc);
      (*peVar12->_vptr_state_mgr[8])(peVar12,0xfffffff0);
      exit(-1);
    }
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3001c8);
    uVar10 = snapshot::get_last_log_idx(peVar9);
    if (uVar10 < uVar18) goto LAB_003001f3;
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x300506);
    tVar2 = snapshot::get_type(peVar9);
    if (tVar2 == raw_binary) {
      peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x300537);
      uVar10 = snapshot::size(peVar9);
      if (uVar10 == 0) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar1) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x30058c);
          iVar4 = (*peVar11->_vptr_logger[7])();
          if (1 < iVar4) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x3005c5);
            msg_if_given_abi_cxx11_
                      ((char *)local_150,
                       "invalid snapshot, this usually means a bug from state machine implementation, stop the system to prevent further errors"
                      );
            (*peVar11->_vptr_logger[8])
                      (peVar11,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                       ,"create_sync_snapshot_req",0x88,local_150);
            std::__cxx11::string::~string(local_150);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x300662);
        peVar12 = std::
                  __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x30066a);
        (*peVar12->_vptr_state_mgr[8])(peVar12,0xffffffef);
        exit(-1);
      }
    }
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x300694);
    uVar10 = snapshot::get_last_log_idx(peVar9);
    if ((uVar10 != local_90) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318)), bVar1))
    {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3006ed);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x300726);
        peVar9 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30073b);
        uVar10 = snapshot::get_last_log_idx(peVar9);
        uVar3 = peer::get_id((peer *)0x30075a);
        msg_if_given_abi_cxx11_
                  ((char *)local_170,
                   "trying to sync snapshot with last index %lu to peer %d, its last log idx %lu",
                   uVar10,(ulong)uVar3,local_20);
        (*peVar11->_vptr_logger[8])
                  (peVar11,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0x92,local_170);
        std::__cxx11::string::~string(local_170);
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
    if (bVar1) {
      std::shared_ptr<nuraft::snapshot_sync_ctx>::shared_ptr
                ((shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffa50,
                 (shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffa48);
      destroy_user_snp_ctx
                ((raft_server *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                 in_stack_fffffffffffffaa8);
      std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
                ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x300851);
    }
    std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
              ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x30088d);
    nuraft::context::get_params((context *)in_stack_fffffffffffffa68);
    peVar13 = std::
              __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x3008b4);
    iVar4 = peVar13->heart_beat_interval_;
    _Var5 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffa58);
    std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x3008f1);
    local_188 = (long)(iVar4 * _Var5);
    peer::set_snapshot_in_sync
              ((peer *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
               (ptr<snapshot> *)in_stack_fffffffffffffa98,(ulong)in_stack_fffffffffffffa90);
  }
  peVar13 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x30092f);
  if ((peVar13->use_bg_thread_for_snapshot_io_ & 1U) != 0) {
    snapshot_io_mgr::instance();
    std::enable_shared_from_this<nuraft::raft_server>::shared_from_this
              ((enable_shared_from_this<nuraft::raft_server> *)in_stack_fffffffffffffa48);
    std::shared_ptr<nuraft::peer>::shared_ptr
              ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffa50,
               (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffa48);
    std::operator==((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffa50,
                    (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffa48);
    snapshot_io_mgr::push
              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
               (ptr<peer> *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               (function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)in_stack_fffffffffffffab8);
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x3009fc);
    std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x300a09);
    *in_stack_00000008 = 1;
    std::shared_ptr<nuraft::req_msg>::shared_ptr
              ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    local_1bc = 1;
    goto LAB_00301617;
  }
  local_1bd = 0;
  std::shared_ptr<nuraft::buffer>::shared_ptr
            ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  local_1d8 = (raft_server *)0x0;
  peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x300a9a);
  tVar2 = snapshot::get_type(peVar9);
  if (tVar2 == raw_binary) {
    peer::get_snapshot_sync_ctx((peer *)in_stack_fffffffffffffa68);
    peVar14 = std::
              __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x300ae2);
    prVar15 = (raft_server *)snapshot_sync_ctx::get_offset(peVar14);
    std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
              ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x300b01);
    local_1e0 = prVar15;
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x300b1e);
    prVar15 = (raft_server *)snapshot::size(peVar9);
    if (local_1e0 < prVar15) {
      peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x300b4f);
      uVar10 = snapshot::size(peVar9);
      local_488 = uVar10 - (long)local_1e0;
    }
    else {
      local_488 = 0;
    }
    local_1f8[0] = local_488;
    local_1fc = get_snapshot_sync_block_size(in_stack_fffffffffffffa60);
    local_218[0] = (unsigned_long)local_1fc;
    std::min<unsigned_long>(local_218,local_1f8);
    nuraft::buffer::alloc(CONCAT17(tVar2,in_stack_fffffffffffffb98));
    std::shared_ptr<nuraft::buffer>::operator=
              ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa50,
               (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa48);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x300c36);
    peVar16 = std::
              __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x300c4a);
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffa50);
    prVar15 = local_1e0;
    peVar17 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)in_stack_fffffffffffffa50);
    local_21c = (*peVar16->_vptr_state_machine[0xd])(peVar16,peVar9,prVar15,peVar17);
    uVar18 = (ulong)(int)local_21c;
    peVar17 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x300cdc);
    sVar19 = nuraft::buffer::size(peVar17);
    prVar15 = local_1e0;
    if (uVar18 < sVar19) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
      if (bVar1) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x300d38);
        iVar4 = (*peVar11->_vptr_logger[7])();
        if (1 < iVar4) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x300d71);
          uVar3 = local_21c;
          peVar17 = std::
                    __shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x300d94);
          sVar19 = nuraft::buffer::size(peVar17);
          msg_if_given_abi_cxx11_
                    ((char *)local_240,
                     "only %d bytes could be read from snapshot while %zu bytes are expected, must be something wrong, exit."
                     ,(ulong)uVar3,sVar19);
          (*peVar11->_vptr_logger[8])
                    (peVar11,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                     ,"create_sync_snapshot_req",0xbc,local_240);
          std::__cxx11::string::~string(local_240);
        }
      }
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x300e89);
      peVar12 = std::
                __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x300e91);
      (*peVar12->_vptr_state_mgr[8])(peVar12,0xffffffee);
      exit(-1);
    }
    peVar17 = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x300ecb);
    sVar19 = nuraft::buffer::size(peVar17);
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x300f05);
    uVar10 = snapshot::size(peVar9);
    local_1bd = uVar10 <= (long)&prVar15->_vptr_raft_server + sVar19;
    local_1d8 = local_1e0;
LAB_0030132a:
    operator_new(0x30);
    snapshot_sync_req::snapshot_sync_req
              (in_stack_fffffffffffffa70,(ptr<snapshot> *)in_stack_fffffffffffffa68,
               (ulong)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
               SUB81((ulong)in_stack_fffffffffffffa50 >> 0x38,0));
    std::unique_ptr<nuraft::snapshot_sync_req,std::default_delete<nuraft::snapshot_sync_req>>::
    unique_ptr<std::default_delete<nuraft::snapshot_sync_req>,void>
              ((unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    local_2b1 = 0;
    local_2b8 = 0x10;
    args_1 = (msg_type *)(in_RSI + 0x38);
    iVar6 = peer::get_id((peer *)0x3013af);
    local_2bc = iVar6;
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3013cd);
    args_2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)snapshot::get_last_log_term(peVar9);
    local_2d0.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         args_2;
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3013f6);
    local_2d0.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)snapshot::get_last_log_idx(peVar9);
    in_stack_fffffffffffffa50 = (unique_lock<std::mutex> *)(local_78 + 0x48);
    __x = &local_2d0;
    cs_new<nuraft::req_msg,unsigned_long&,nuraft::msg_type,int&,int,unsigned_long,unsigned_long,unsigned_long&>
              ((unsigned_long *)CONCAT44(iVar6,in_stack_fffffffffffffa78),args_1,(int *)args_2,
               (int *)local_2d0.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(unsigned_long *)in_stack_fffffffffffffa58,in_stack_fffffffffffffa90,
               (unsigned_long *)in_stack_fffffffffffffa98);
    this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x30146d);
    args = req_msg::log_entries(this_00);
    std::unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>::
    operator->((unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                *)0x301489);
    snapshot_sync_req::serialize(in_stack_fffffffffffffab8);
    cs_new<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((unsigned_long *)args,(shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffa50,
               (log_val_type *)__x);
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)in_stack_fffffffffffffa50,__x);
    std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x3014eb);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x3014f8);
    *in_stack_00000008 = 1;
    local_1bc = 1;
    local_2b1 = 1;
    std::unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>::
    ~unique_ptr((unique_ptr<nuraft::snapshot_sync_req,_std::default_delete<nuraft::snapshot_sync_req>_>
                 *)in_stack_fffffffffffffa50);
  }
  else {
    peer::get_snapshot_sync_ctx((peer *)in_stack_fffffffffffffa68);
    pp_00 = (peer *)local_78;
    std::shared_ptr<nuraft::snapshot_sync_ctx>::operator=
              ((shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffa50,
               (shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffa48);
    std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
              ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x300f94);
    peVar14 = std::
              __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x300fa1);
    prVar15 = (raft_server *)snapshot_sync_ctx::get_offset(peVar14);
    local_258 = prVar15;
    peVar14 = std::
              __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x300fd0);
    local_260 = snapshot_sync_ctx::get_user_snp_ctx(peVar14);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x301023);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (4 < iVar4) {
        in_stack_fffffffffffffab8 =
             (snapshot_sync_req *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x301056);
        uVar3 = peer::get_id((peer *)0x301068);
        msg_if_given_abi_cxx11_
                  ((char *)local_280,"peer: %d, obj_idx: %lu, user_snp_ctx %p",(ulong)uVar3,
                   local_258,*local_260);
        (*(*(_func_int ***)&((_Function_base *)&in_stack_fffffffffffffab8->snapshot_)->_M_functor)
          [8])(in_stack_fffffffffffffab8,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"create_sync_snapshot_req",0xcc,local_280);
        std::__cxx11::string::~string(local_280);
      }
    }
    peVar16 = std::
              __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x301117);
    peVar9 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffffa50);
    local_284 = (*peVar16->_vptr_state_machine[0xe])
                          (peVar16,peVar9,local_260,local_258,local_1d0,&local_1bd);
    if (-1 < (int)local_284) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_1d0);
      if (bVar1) {
        std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x30130a);
        nuraft::buffer::pos((buffer *)in_stack_fffffffffffffa70,(size_t)in_stack_fffffffffffffa68);
      }
      local_1d8 = local_258;
      goto LAB_0030132a;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3011aa);
      iVar4 = (*peVar11->_vptr_logger[7])();
      if (2 < iVar4) {
        peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x3011dd);
        peVar9 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x3011ef);
        uVar10 = snapshot::get_last_log_idx(peVar9);
        peVar9 = std::
                 __shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30120b);
        uVar20 = snapshot::get_last_log_term(peVar9);
        msg_if_given_abi_cxx11_
                  ((char *)local_2a8,"reading snapshot (idx %lu, term %lu, object %lu) failed: %d",
                   uVar10,uVar20,local_258,(ulong)local_284);
        (*peVar11->_vptr_logger[8])
                  (peVar11,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"create_sync_snapshot_req",0xd6,local_2a8);
        std::__cxx11::string::~string(local_2a8);
      }
    }
    clear_snapshot_sync_ctx(prVar15,pp_00);
    std::shared_ptr<nuraft::req_msg>::shared_ptr
              ((shared_ptr<nuraft::req_msg> *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    local_1bc = 1;
  }
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x301606);
LAB_00301617:
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x301624);
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x301631);
  std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffa50);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x30164b);
  pVar21.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar21.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<req_msg>)pVar21.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_sync_snapshot_req(ptr<peer>& pp,
                                                   ulong last_log_idx,
                                                   ulong term,
                                                   ulong commit_idx,
                                                   bool& succeeded_out) {
    succeeded_out = false;
    peer& p = *pp;
    ptr<raft_params> params = ctx_->get_params();
    std::unique_lock<std::mutex> guard(p.get_lock());
    ptr<snapshot_sync_ctx> sync_ctx = p.get_snapshot_sync_ctx();
    ptr<snapshot> snp = nullptr;
    ulong prev_sync_snp_log_idx = 0;
    if (sync_ctx) {
        snp = sync_ctx->get_snapshot();
        p_db( "previous sync_ctx exists %p, offset %" PRIu64 ", snp idx %" PRIu64
              ", user_ctx %p",
              sync_ctx.get(),
              sync_ctx->get_offset(),
              snp->get_last_log_idx(),
              sync_ctx->get_user_snp_ctx() );
        prev_sync_snp_log_idx = snp->get_last_log_idx();

        if (sync_ctx->get_timer().timeout()) {
            p_in("previous sync_ctx %p timed out, reset it", sync_ctx.get());
            destroy_user_snp_ctx(sync_ctx);
            sync_ctx.reset();
            snp.reset();
        }
    }

    // Modified by Jung-Sang Ahn, May 15 2018:
    //   Even though new snapshot has been created,
    //   keep using existing snapshot, as new snapshot will reset
    //   previous catching-up.
    //
    // if ( !snp /*||
    //      ( last_snapshot_ &&
    //        last_snapshot_->get_last_log_idx() > snp->get_last_log_idx() )*/ ) {
    if ( !snp || sync_ctx->get_offset() == 0 ) {
        snp = get_last_snapshot();
        if ( snp == nilptr ||
             last_log_idx > snp->get_last_log_idx() ) {
            // LCOV_EXCL_START
            p_er( "system is running into fatal errors, failed to find a "
                  "snapshot for peer %d (snapshot null: %d, snapshot "
                  "doesn't contais lastLogIndex: %d)",
                  p.get_id(), snp == nilptr ? 1 : 0,
                  last_log_idx > snp->get_last_log_idx() ? 1 : 0 );
            if (snp) {
                p_er("last log idx %" PRIu64 ", snp last log idx %" PRIu64,
                     last_log_idx, snp->get_last_log_idx());
            }
            ctx_->state_mgr_->system_exit(raft_err::N16_snapshot_for_peer_not_found);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }

        if ( snp->get_type() == snapshot::raw_binary &&
             snp->size() < 1L ) {
            // LCOV_EXCL_START
            p_er("invalid snapshot, this usually means a bug from state "
                 "machine implementation, stop the system to prevent "
                 "further errors");
            ctx_->state_mgr_->system_exit(raft_err::N17_empty_snapshot);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }

        if (snp->get_last_log_idx() != prev_sync_snp_log_idx) {
            p_in( "trying to sync snapshot with last index %" PRIu64 " to peer %d, "
                  "its last log idx %" PRIu64 "",
                  snp->get_last_log_idx(), p.get_id(), last_log_idx );
        }
        if (sync_ctx) {
            // If previous user context exists, should free it
            // as it causes memory leak.
            destroy_user_snp_ctx(sync_ctx);
        }

        // Timeout: heartbeat * response limit.
        ulong snp_timeout_ms = ctx_->get_params()->heart_beat_interval_ *
                               raft_server::raft_limits_.response_limit_;
        p.set_snapshot_in_sync(snp, snp_timeout_ms);
    }

    if (params->use_bg_thread_for_snapshot_io_) {
        // If async snapshot IO, push the snapshot read request to the manager
        // and immediately return here.
        snapshot_io_mgr::instance().push( this->shared_from_this(),
                                          pp,
                                          ( (pp == srv_to_join_)
                                            ? ex_resp_handler_
                                            : resp_handler_ ) );
        succeeded_out = true;
        return nullptr;
    }
    // Otherwise (sync snapshot IO), read the requested object here and then return.

    bool last_request = false;
    ptr<buffer> data = nullptr;
    ulong data_idx = 0;
    if (snp->get_type() == snapshot::raw_binary) {
        // LCOV_EXCL_START
        // Raw binary snapshot (original)
        ulong offset = p.get_snapshot_sync_ctx()->get_offset();
        ulong sz_left = ( snp->size() > offset ) ? ( snp->size() - offset ) : 0;
        int32 blk_sz = get_snapshot_sync_block_size();
        data = buffer::alloc((size_t)(std::min((ulong)blk_sz, sz_left)));
        int32 sz_rd = state_machine_->read_snapshot_data(*snp, offset, *data);
        if ((size_t)sz_rd < data->size()) {
            // LCOV_EXCL_START
            p_er( "only %d bytes could be read from snapshot while %zu "
                  "bytes are expected, must be something wrong, exit.",
                  sz_rd, data->size() );
            ctx_->state_mgr_->system_exit(raft_err::N18_partial_snapshot_block);
            ::exit(-1);
            return ptr<req_msg>();
            // LCOV_EXCL_STOP
        }
        last_request = (offset + (ulong)data->size()) >= snp->size();
        data_idx = offset;
        // LCOV_EXCL_STOP

    } else {
        // Logical object type snapshot
        sync_ctx = p.get_snapshot_sync_ctx();
        ulong obj_idx = sync_ctx->get_offset();
        void*& user_snp_ctx = sync_ctx->get_user_snp_ctx();
        p_dv("peer: %d, obj_idx: %" PRIu64 ", user_snp_ctx %p",
             (int)p.get_id(), obj_idx, user_snp_ctx);

        int rc = state_machine_->read_logical_snp_obj( *snp, user_snp_ctx, obj_idx,
                                                       data, last_request );
        if (rc < 0) {
            p_wn( "reading snapshot (idx %" PRIu64 ", term %" PRIu64
                  ", object %" PRIu64 ") failed: %d",
                  snp->get_last_log_idx(),
                  snp->get_last_log_term(),
                  obj_idx,
                  rc );
            // Reset the `sync_ctx` so as to retry with the newer version.
            clear_snapshot_sync_ctx(p);
            return nullptr;
        }
        if (data) data->pos(0);
        data_idx = obj_idx;
    }

    std::unique_ptr<snapshot_sync_req> sync_req
        ( new snapshot_sync_req(snp, data_idx, data, last_request) );
    ptr<req_msg> req( cs_new<req_msg>
                      ( term,
                        msg_type::install_snapshot_request,
                        id_,
                        p.get_id(),
                        snp->get_last_log_term(),
                        snp->get_last_log_idx(),
                        commit_idx ) );
    req->log_entries().push_back( cs_new<log_entry>
                                  ( term,
                                    sync_req->serialize(),
                                    log_val_type::snp_sync_req ) );

    succeeded_out = true;
    return req;
}